

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartialUnion.cpp
# Opt level: O1

void __thiscall dgrminer::PartialUnion::printEncoding(PartialUnion *this)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  ostream *poVar3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  _Rb_tree_header *p_Var7;
  _Self __tmp;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"LABELING:",9);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
  std::ostream::put(-0x58);
  std::ostream::flush();
  p_Var5 = (this->labelEncoding)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->labelEncoding)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var5 != p_Var1) {
    p_Var2 = &(this->antecedentLabelsOfLabels)._M_t._M_impl.super__Rb_tree_header;
    do {
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,*(char **)(p_Var5 + 1),(long)p_Var5[1]._M_parent);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,p_Var5[2]._M_color);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," (OLD: ",7);
      p_Var6 = (this->antecedentLabelsOfLabels)._M_t._M_impl.super__Rb_tree_header._M_header.
               _M_parent;
      p_Var4 = &p_Var2->_M_header;
      if (p_Var6 != (_Base_ptr)0x0) {
        do {
          if ((int)p_Var5[2]._M_color <= (int)*(size_t *)(p_Var6 + 1)) {
            p_Var4 = p_Var6;
          }
          p_Var6 = (&p_Var6->_M_left)[(int)*(size_t *)(p_Var6 + 1) < (int)p_Var5[2]._M_color];
        } while (p_Var6 != (_Base_ptr)0x0);
      }
      p_Var7 = p_Var2;
      if (((_Rb_tree_header *)p_Var4 != p_Var2) &&
         (p_Var7 = (_Rb_tree_header *)p_Var4,
         (int)p_Var5[2]._M_color < (int)((_Rb_tree_header *)p_Var4)->_M_node_count)) {
        p_Var7 = p_Var2;
      }
      poVar3 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)poVar3,*(int *)((long)&p_Var7->_M_node_count + 4));
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
    } while ((_Rb_tree_header *)p_Var5 != p_Var1);
  }
  return;
}

Assistant:

void PartialUnion::printEncoding()
	{
		cout << "LABELING:" << endl;
		std::map<std::string, int>::iterator i;
		for (i = labelEncoding.begin(); i != labelEncoding.end(); i++)
		{
			std::cout << i->first << " " << i->second << " (OLD: " << antecedentLabelsOfLabels.find(i->second)->second << ")" << std::endl;
		}
	}